

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::InterpolateKeys
          (FBXConverter *this,aiVectorKey *valOut,KeyTimeList *keys,KeyFrameListList *inputs,
          aiVector3D *def_value,double *max_time,double *min_time)

{
  double dVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  pointer ptVar5;
  vector<long,_std::allocator<long>_> *this_00;
  double dVar6;
  uint uVar7;
  size_type __new_size;
  long *plVar8;
  reference pvVar9;
  reference pvVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  size_t i;
  size_type sVar14;
  size_type __n;
  long lVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double local_a8;
  float local_a0;
  value_type local_98;
  value_type local_94;
  KeyFrameListList *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next_pos;
  
  local_90 = inputs;
  if ((keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    __assert_fail("!keys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0xcf4,
                  "void Assimp::FBX::FBXConverter::InterpolateKeys(aiVectorKey *, const KeyTimeList &, const KeyFrameListList &, const aiVector3D &, double &, double &)"
                 );
  }
  if (valOut != (aiVectorKey *)0x0) {
    next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __new_size = ((long)(inputs->
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inputs->
                       super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x28;
    local_a8 = (double)((ulong)local_a8 & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&next_pos,__new_size,(value_type_conflict2 *)&local_a8);
    plVar3 = (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    for (plVar8 = (keys->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_start; plVar8 != plVar3; plVar8 = plVar8 + 1) {
      lVar4 = *plVar8;
      local_a8 = *(double *)def_value;
      local_a0 = def_value->z;
      lVar15 = 6;
      for (sVar14 = 0; __new_size != sVar14; sVar14 = sVar14 + 1) {
        ptVar5 = (local_90->
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        this_00 = *(vector<long,_std::allocator<long>_> **)
                   ((long)&(ptVar5->
                           super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                           ).
                           super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                           .super__Tuple_impl<2UL,_unsigned_int> + lVar15 * 4);
        lVar12 = (long)(this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        if (lVar12 != 0) {
          uVar13 = lVar12 >> 3;
          if (next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[sVar14] < uVar13) {
            pvVar9 = std::vector<long,_std::allocator<long>_>::at
                               (this_00,(ulong)next_pos.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start[sVar14]);
            if (*pvVar9 == lVar4) {
              next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[sVar14] =
                   next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar14] + 1;
            }
          }
          uVar2 = next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar14];
          uVar7 = uVar2 - 1;
          if (uVar2 == 0) {
            uVar7 = 0;
          }
          __n = uVar13 - 1;
          if (uVar13 != uVar2) {
            __n = (ulong)uVar2;
          }
          pvVar10 = std::vector<float,_std::allocator<float>_>::at
                              (*(vector<float,_std::allocator<float>_> **)
                                ((long)ptVar5 + lVar15 * 4 + -0x10),(ulong)uVar7);
          local_94 = *pvVar10;
          pvVar10 = std::vector<float,_std::allocator<float>_>::at
                              (*(vector<float,_std::allocator<float>_> **)
                                ((long)ptVar5 + lVar15 * 4 + -0x10),__n);
          local_98 = *pvVar10;
          pvVar9 = std::vector<long,_std::allocator<long>_>::at
                             (*(vector<long,_std::allocator<long>_> **)
                               ((long)&(ptVar5->
                                       super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       ).
                                       super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       .super__Tuple_impl<2UL,_unsigned_int> + lVar15 * 4),
                              (ulong)uVar7);
          lVar12 = *pvVar9;
          pvVar9 = std::vector<long,_std::allocator<long>_>::at
                             (*(vector<long,_std::allocator<long>_> **)
                               ((long)&(ptVar5->
                                       super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       ).
                                       super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       .super__Tuple_impl<2UL,_unsigned_int> + lVar15 * 4),__n);
          fVar16 = 0.0;
          lVar11 = *pvVar9 - lVar12;
          if (lVar11 != 0) {
            fVar16 = (float)(lVar4 - lVar12) / (float)lVar11;
          }
          *(float *)((long)&local_a8 + (ulong)*(uint *)((long)ptVar5 + lVar15 * 4 + -0x18) * 4) =
               (local_98 - local_94) * fVar16 + local_94;
        }
        lVar15 = lVar15 + 10;
      }
      dVar6 = ((double)lVar4 / 46186158000.0) * this->anim_fps;
      valOut->mTime = dVar6;
      if (*min_time <= dVar6) {
        dVar6 = *min_time;
      }
      *min_time = dVar6;
      dVar6 = valOut->mTime;
      uVar17 = SUB84(dVar6,0);
      uVar18 = (undefined4)((ulong)dVar6 >> 0x20);
      dVar1 = *max_time;
      if (dVar6 <= dVar1) {
        uVar17 = SUB84(dVar1,0);
        uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      *max_time = (double)CONCAT44(uVar18,uVar17);
      *(double *)&valOut->mValue = local_a8;
      (valOut->mValue).z = local_a0;
      valOut = valOut + 1;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return;
  }
  __assert_fail("nullptr != valOut",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                ,0xcf5,
                "void Assimp::FBX::FBXConverter::InterpolateKeys(aiVectorKey *, const KeyTimeList &, const KeyFrameListList &, const aiVector3D &, double &, double &)"
               );
}

Assistant:

void FBXConverter::InterpolateKeys(aiVectorKey* valOut, const KeyTimeList& keys, const KeyFrameListList& inputs,
            const aiVector3D& def_value,
            double& max_time,
            double& min_time) {
            ai_assert(!keys.empty());
            ai_assert(nullptr != valOut);

            std::vector<unsigned int> next_pos;
            const size_t count(inputs.size());

            next_pos.resize(inputs.size(), 0);

            for (KeyTimeList::value_type time : keys) {
                ai_real result[3] = { def_value.x, def_value.y, def_value.z };

                for (size_t i = 0; i < count; ++i) {
                    const KeyFrameList& kfl = inputs[i];

                    const size_t ksize = std::get<0>(kfl)->size();
                    if (ksize == 0) {
                        continue;
                    }
                    if (ksize > next_pos[i] && std::get<0>(kfl)->at(next_pos[i]) == time) {
                        ++next_pos[i];
                    }

                    const size_t id0 = next_pos[i] > 0 ? next_pos[i] - 1 : 0;
                    const size_t id1 = next_pos[i] == ksize ? ksize - 1 : next_pos[i];

                    // use lerp for interpolation
                    const KeyValueList::value_type valueA = std::get<1>(kfl)->at(id0);
                    const KeyValueList::value_type valueB = std::get<1>(kfl)->at(id1);

                    const KeyTimeList::value_type timeA = std::get<0>(kfl)->at(id0);
                    const KeyTimeList::value_type timeB = std::get<0>(kfl)->at(id1);

                    const ai_real factor = timeB == timeA ? ai_real(0.) : static_cast<ai_real>((time - timeA)) / (timeB - timeA);
                    const ai_real interpValue = static_cast<ai_real>(valueA + (valueB - valueA) * factor);

                    result[std::get<2>(kfl)] = interpValue;
                }

                // magic value to convert fbx times to seconds
                valOut->mTime = CONVERT_FBX_TIME(time) * anim_fps;

                min_time = std::min(min_time, valOut->mTime);
                max_time = std::max(max_time, valOut->mTime);

                valOut->mValue.x = result[0];
                valOut->mValue.y = result[1];
                valOut->mValue.z = result[2];

                ++valOut;
            }
        }